

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O1

void __thiscall
brotli::BlockEncoder::BuildAndStoreEntropyCodes<520>
          (BlockEncoder *this,
          vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *histograms,
          size_t *storage_ix,uint8_t *storage)

{
  long lVar1;
  long lVar2;
  pointer pHVar3;
  ulong uVar4;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->depths_,
             ((long)(histograms->
                    super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(histograms->
                    super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * this->alphabet_size_ *
             0x3e88cb3c9484e2b);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->bits_,
             ((long)(histograms->
                    super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(histograms->
                    super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * this->alphabet_size_ *
             0x3e88cb3c9484e2b);
  pHVar3 = (histograms->
           super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((histograms->
      super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>)._M_impl.
      super__Vector_impl_data._M_finish != pHVar3) {
    lVar2 = 0;
    uVar4 = 0;
    do {
      lVar1 = this->alphabet_size_ * uVar4;
      BuildAndStoreHuffmanTree
                ((uint32_t *)((long)pHVar3->data_ + lVar2),this->alphabet_size_,
                 (this->depths_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar1,
                 (this->bits_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar1,storage_ix,storage);
      uVar4 = uVar4 + 1;
      pHVar3 = (histograms->
               super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x830;
    } while (uVar4 < (ulong)(((long)(histograms->
                                    super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar3 >> 4)
                            * 0x3e88cb3c9484e2b));
  }
  return;
}

Assistant:

void BuildAndStoreEntropyCodes(
      const std::vector<Histogram<kSize> >& histograms,
      size_t* storage_ix, uint8_t* storage) {
    depths_.resize(histograms.size() * alphabet_size_);
    bits_.resize(histograms.size() * alphabet_size_);
    for (size_t i = 0; i < histograms.size(); ++i) {
      size_t ix = i * alphabet_size_;
      BuildAndStoreHuffmanTree(&histograms[i].data_[0], alphabet_size_,
                               &depths_[ix], &bits_[ix],
                               storage_ix, storage);
    }
  }